

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenVerifyCall
          (CSharpGenerator *this,CodeWriter *code_,FieldDef *field,char *prefix)

{
  Value *type;
  BaseType BVar1;
  size_t sVar2;
  char *pcVar3;
  string *psVar4;
  string sStack_1e8;
  allocator<char> local_1c1;
  string union_name;
  undefined1 local_1a0 [32];
  Type local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"PRE",(allocator<char> *)local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1e8,prefix,(allocator<char> *)&local_180);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"NAME",(allocator<char> *)local_1a0);
  ConvertCase(&sStack_1e8,(string *)field,kUpperCamel,kSnake);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"REQUIRED",(allocator<char> *)local_1a0);
  pcVar3 = "";
  if (field->presence == kRequired) {
    pcVar3 = "Required";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1e8,pcVar3,(allocator<char> *)&local_180);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"REQUIRED_FLAG",(allocator<char> *)local_1a0);
  pcVar3 = "false";
  if (field->presence == kRequired) {
    pcVar3 = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1e8,pcVar3,(allocator<char> *)&local_180);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"TYPE",(allocator<char> *)local_1a0);
  type = &field->value;
  GenTypeGet_abi_cxx11_(&sStack_1e8,this,&type->type);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"INLINESIZE",(allocator<char> *)local_1a0);
  sVar2 = InlineSize(&type->type);
  NumToString<unsigned_long>(&sStack_1e8,sVar2);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&union_name,"OFFSET",(allocator<char> *)local_1a0);
  NumToString<unsigned_short>(&sStack_1e8,(field->value).offset);
  CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&union_name);
  BVar1 = (type->type).base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
LAB_00181ea7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&union_name,"ALIGN",(allocator<char> *)local_1a0);
    sVar2 = InlineAlignment(&type->type);
    NumToString<unsigned_long>(&sStack_1e8,sVar2);
    CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&union_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "{{PRE}}      && verifier.VerifyField(tablePos, {{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, {{REQUIRED_FLAG}})"
               ,(allocator<char> *)&union_name);
    CodeWriter::operator+=(code_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    BVar1 = (type->type).base_type;
LAB_00181f49:
    switch(BVar1) {
    case BASE_TYPE_STRING:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 "{{PRE}}      && verifier.VerifyString(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
                 ,(allocator<char> *)&union_name);
      CodeWriter::operator+=(code_,&local_a0);
      psVar4 = &local_a0;
      break;
    case BASE_TYPE_VECTOR:
      BVar1 = (field->value).type.element;
      if (BVar1 == BASE_TYPE_UNION) {
        return;
      }
      if (BVar1 == BASE_TYPE_STRUCT) {
        if (((field->value).type.struct_def)->fixed == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,
                     "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
                     ,(allocator<char> *)&union_name);
          CodeWriter::operator+=(code_,&local_e0);
          psVar4 = &local_e0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&union_name,"VECTOR_ELEM_INLINESIZE",(allocator<char> *)&local_180);
          local_1a0._0_4_ = (field->value).type.element;
          local_1a0._24_2_ = (field->value).type.fixed_length;
          local_1a0._4_4_ = BASE_TYPE_NONE;
          local_1a0._8_8_ = (field->value).type.struct_def;
          local_1a0._16_8_ = (field->value).type.enum_def;
          sVar2 = InlineSize((Type *)local_1a0);
          NumToString<unsigned_long>(&sStack_1e8,sVar2);
          CodeWriter::SetValue(code_,&union_name,&sStack_1e8);
          std::__cxx11::string::~string((string *)&sStack_1e8);
          std::__cxx11::string::~string((string *)&union_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,
                     "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                     ,(allocator<char> *)&union_name);
          CodeWriter::operator+=(code_,&local_100);
          psVar4 = &local_100;
        }
      }
      else {
        if (BVar1 != BASE_TYPE_STRING) {
          GetNestedFlatBufferName_abi_cxx11_(&union_name,this,field);
          if (union_name._M_string_length == 0) {
            if (field->flexbuffer == true) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,
                         "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})"
                         ,(allocator<char> *)&sStack_1e8);
              CodeWriter::operator+=(code_,&local_140);
              psVar4 = &local_140;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&sStack_1e8,"VECTOR_ELEM_INLINESIZE",&local_1c1);
              local_180.base_type = (field->value).type.element;
              local_180.fixed_length = (field->value).type.fixed_length;
              local_180.element = BASE_TYPE_NONE;
              local_180.struct_def = (field->value).type.struct_def;
              local_180.enum_def = (field->value).type.enum_def;
              sVar2 = InlineSize(&local_180);
              NumToString<unsigned_long>((string *)local_1a0,sVar2);
              CodeWriter::SetValue(code_,&sStack_1e8,(string *)local_1a0);
              std::__cxx11::string::~string((string *)local_1a0);
              std::__cxx11::string::~string((string *)&sStack_1e8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,
                         "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                         ,(allocator<char> *)&sStack_1e8);
              CodeWriter::operator+=(code_,&local_160);
              psVar4 = &local_160;
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&sStack_1e8,"CPP_NAME",(allocator<char> *)local_1a0);
            CodeWriter::SetValue(code_,&sStack_1e8,&union_name);
            std::__cxx11::string::~string((string *)&sStack_1e8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,
                       "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
                       ,(allocator<char> *)&sStack_1e8);
            CodeWriter::operator+=(code_,&local_120);
            psVar4 = &local_120;
          }
          goto LAB_0018211a;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
                   ,(allocator<char> *)&union_name);
        CodeWriter::operator+=(code_,&local_c0);
        psVar4 = &local_c0;
      }
      break;
    case BASE_TYPE_STRUCT:
      goto switchD_00181f63_caseD_f;
    case BASE_TYPE_UNION:
      NamespacedName_abi_cxx11_(&union_name,this,&((field->value).type.enum_def)->super_Definition);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_1e8,"ENUM_NAME1",(allocator<char> *)local_1a0);
      CodeWriter::SetValue(code_,&sStack_1e8,(string *)(field->value).type.enum_def);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_1e8,"ENUM_NAME",(allocator<char> *)local_1a0);
      CodeWriter::SetValue(code_,&sStack_1e8,&union_name);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_1e8,"SUFFIX",(allocator<char> *)&local_180);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"_type",&local_1c1);
      CodeWriter::SetValue(code_,&sStack_1e8,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_1e8,"TYPE_ID_OFFSET",(allocator<char> *)&local_180);
      NumToString<unsigned_long>((string *)local_1a0,(ulong)(field->value).offset - 2);
      CodeWriter::SetValue(code_,&sStack_1e8,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,
                 "{{PRE}}      && verifier.VerifyUnion(tablePos, {{TYPE_ID_OFFSET}}, {{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
                 ,(allocator<char> *)&sStack_1e8);
      CodeWriter::operator+=(code_,&local_60);
      psVar4 = &local_60;
LAB_0018211a:
      std::__cxx11::string::~string((string *)psVar4);
      psVar4 = &union_name;
      break;
    default:
      goto switchD_00181f63_default;
    }
  }
  else {
    if (BVar1 != BASE_TYPE_STRUCT) goto LAB_00181f49;
    if (((field->value).type.struct_def)->fixed == true) goto LAB_00181ea7;
switchD_00181f63_caseD_f:
    if (((field->value).type.struct_def)->fixed != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "{{PRE}}      && verifier.VerifyTable(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
               ,(allocator<char> *)&union_name);
    CodeWriter::operator+=(code_,&local_80);
    psVar4 = &local_80;
  }
  std::__cxx11::string::~string((string *)psVar4);
switchD_00181f63_default:
  return;
}

Assistant:

void GenVerifyCall(CodeWriter &code_, const FieldDef &field,
                     const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("NAME", ConvertCase(field.name, Case::kUpperCamel));
    code_.SetValue("REQUIRED", field.IsRequired() ? "Required" : "");
    code_.SetValue("REQUIRED_FLAG", field.IsRequired() ? "true" : "false");
    code_.SetValue("TYPE", GenTypeGet(field.value.type));
    code_.SetValue("INLINESIZE", NumToString(InlineSize(field.value.type)));
    code_.SetValue("OFFSET", NumToString(field.value.offset));

    if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type)) {
      code_.SetValue("ALIGN", NumToString(InlineAlignment(field.value.type)));
      code_ +=
          "{{PRE}}      && verifier.VerifyField(tablePos, "
          "{{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, "
          "{{REQUIRED_FLAG}})";
    } else {
      // TODO - probably code below should go to this 'else' - code_ +=
      // "{{PRE}}VerifyOffset{{REQUIRED}}(verifier, {{OFFSET}})\\";
    }

    switch (field.value.type.base_type) {
      case BASE_TYPE_UNION: {
        auto union_name = NamespacedName(*field.value.type.enum_def);
        code_.SetValue("ENUM_NAME1", field.value.type.enum_def->name);
        code_.SetValue("ENUM_NAME", union_name);
        code_.SetValue("SUFFIX", UnionTypeFieldSuffix());
        // Caution: This construction assumes, that UNION type id element has
        // been created just before union data and its offset precedes union.
        // Such assumption is common in flatbuffer implementation
        code_.SetValue("TYPE_ID_OFFSET",
                       NumToString(field.value.offset - sizeof(voffset_t)));
        code_ +=
            "{{PRE}}      && verifier.VerifyUnion(tablePos, "
            "{{TYPE_ID_OFFSET}}, "
            "{{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, "
            "{{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (!field.value.type.struct_def->fixed) {
          code_ +=
              "{{PRE}}      && verifier.VerifyTable(tablePos, "
              "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
              "{{REQUIRED_FLAG}})";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ +=
            "{{PRE}}      && verifier.VerifyString(tablePos, "
            "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_VECTOR: {
        switch (field.value.type.element) {
          case BASE_TYPE_STRING: {
            code_ +=
                "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, "
                "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (!field.value.type.struct_def->fixed) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && "
                  "verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
          }
          case BASE_TYPE_UNION: {
            // Vectors of unions are not yet supported for go
            break;
          }
          default:
            // Generate verifier for vector of data.
            // It may be either nested flatbuffer of just vector of bytes
            auto nfn = GetNestedFlatBufferName(field);
            if (!nfn.empty()) {
              code_.SetValue("CPP_NAME", nfn);
              // FIXME: file_identifier.
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else if (field.flexbuffer) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
        }

        break;
      }
      default: {
        break;
      }
    }
  }